

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

CQualifier * Refal2::getDefaultQualifierForN(void)

{
  int iVar1;
  CQualifier *this;
  undefined1 local_208 [8];
  CQualifierBuilder qualifierBuilder;
  
  if (getDefaultQualifierForN()::qualifier == '\0') {
    iVar1 = __cxa_guard_acquire(&getDefaultQualifierForN()::qualifier);
    if (iVar1 != 0) {
      this = (CQualifier *)operator_new(0x48);
      CQualifier::CQualifier(this);
      getDefaultQualifierForN::qualifier = this;
      __cxa_guard_release(&getDefaultQualifierForN()::qualifier);
    }
  }
  if (getDefaultQualifierForN::qualifier == (CQualifier *)0x0) {
    CQualifierBuilder::CQualifierBuilder((CQualifierBuilder *)local_208);
    CQualifierBuilder::AddN((CQualifierBuilder *)local_208);
    CQualifierBuilder::AddNegative((CQualifierBuilder *)local_208);
    CQualifierBuilder::Export((CQualifierBuilder *)local_208,getDefaultQualifierForN::qualifier);
    CQualifierBuilder::~CQualifierBuilder((CQualifierBuilder *)local_208);
  }
  return getDefaultQualifierForN::qualifier;
}

Assistant:

static const CQualifier* getDefaultQualifierForN()
{
	static CQualifier* const qualifier = new CQualifier;
	if( qualifier == 0 ) {
		CQualifierBuilder qualifierBuilder;
		qualifierBuilder.AddN();
		qualifierBuilder.AddNegative();
		qualifierBuilder.Export( *qualifier );
	}
	return qualifier;
}